

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O2

wchar_t cmd_get_effect_from_list
                  (command_conflict *cmd,char *arg,int *choice,char *prompt,effect *effect,
                  wchar_t count,_Bool allow_random)

{
  wchar_t wVar1;
  effect *cursor;
  effect *effect_00;
  wchar_t local_44;
  char *local_40;
  wchar_t *local_38;
  
  local_40 = prompt;
  local_38 = choice;
  if (count == L'\xffffffff') {
    count = L'\0';
    for (effect_00 = effect; effect_00 != (effect *)0x0; effect_00 = effect_next(effect_00)) {
      count = count + L'\x01';
    }
  }
  wVar1 = cmd_get_arg_choice(cmd,arg,&local_44);
  if (wVar1 == L'\0') {
    if (local_44 == L'\xfffffffe' && allow_random) {
      wVar1 = L'\xfffffffe';
      goto LAB_0012dc40;
    }
    wVar1 = local_44;
    if (local_44 < L'\0' || count <= local_44) goto LAB_0012dc01;
  }
  else {
LAB_0012dc01:
    wVar1 = get_effect_from_list(local_40,effect,count,allow_random);
LAB_0012dc40:
    if (wVar1 == L'\xfffffffe' && allow_random) {
      wVar1 = L'\xfffffffe';
      goto LAB_0012dc6f;
    }
  }
  if (count <= wVar1 || wVar1 < L'\0') {
    return L'\xfffffffd';
  }
LAB_0012dc6f:
  cmd_set_arg_choice(cmd,arg,wVar1);
  *local_38 = wVar1;
  return L'\0';
}

Assistant:

int cmd_get_effect_from_list(struct command *cmd, const char *arg, int *choice,
	const char *prompt, struct effect *effect, int count,
	bool allow_random)
{
	int selection;

	if (count == -1) {
		struct effect *cursor = effect;

		count = 0;
		while (cursor) {
			++count;
			cursor = effect_next(cursor);
		}
	}

	if (cmd_get_arg_choice(cmd, arg, &selection) != CMD_OK ||
			((selection != -2 || !allow_random) &&
			(selection < 0 || selection >= count))) {
		/* It isn't in the command or is invalid; prompt. */
		selection = get_effect_from_list(prompt, effect, count,
			allow_random);
	}
	if ((selection == -2 && allow_random) ||
			(selection >= 0 && selection < count)) {
		/* Record the selection in the command. */
		cmd_set_arg_choice(cmd, arg, selection);
		*choice = selection;
		return CMD_OK;
	}
	return CMD_ARG_ABORTED;
}